

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void Potassco::Application::sigHandler(int sig)

{
  int in_EDI;
  ScopedSig scoped;
  
  sigHandler::ScopedSig::ScopedSig((ScopedSig *)CONCAT44(sig,scoped.sig),in_EDI);
  sigHandler::ScopedSig::~ScopedSig((ScopedSig *)0x109499);
  return;
}

Assistant:

void Application::sigHandler(int sig) {
	// On Windows and original Unix, a handler once invoked is set to SIG_DFL.
	// Instead, we temporarily ignore signals and reset our handler once it is done.
	struct ScopedSig {
		ScopedSig(int s) : sig(s) { signal(sig, SIG_IGN); Application::getInstance()->processSignal(sig); }
		~ScopedSig()              { signal(sig, sigHandler); }
		int sig;
	} scoped(sig); (void)scoped;
}